

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpASIOServer.cpp
# Opt level: O3

void __thiscall mognetwork::TcpASIOServer::remSocket(TcpASIOServer *this,SocketFD socket)

{
  size_t *psVar1;
  TcpSocket *this_00;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  SocketFD SVar4;
  
  p_Var3 = (this->m_socketList).
           super__List_base<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 != (_List_node_base *)&this->m_socketList) {
    SVar4 = Socket::getSocketFD((Socket *)p_Var3[1]._M_next);
    if (SVar4 == socket) {
      this_00 = (TcpSocket *)p_Var3[1]._M_next;
      TcpSocket::disconnect(this_00);
      p_Var2 = p_Var3->_M_next;
      psVar1 = &(this->m_socketList).
                super__List_base<mognetwork::TcpSocket_*,_std::allocator<mognetwork::TcpSocket_*>_>.
                _M_impl._M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var3);
      (*(this_00->super_Socket)._vptr_Socket[1])(this_00);
      p_Var3 = p_Var2;
    }
    else {
      p_Var3 = p_Var3->_M_next;
    }
  }
  return;
}

Assistant:

void TcpASIOServer::remSocket(SocketFD socket)
  {
    for (std::list<TcpSocket*>::iterator it = m_socketList.begin(); it != m_socketList.end();)
      {
	if ((*it)->getSocketFD() == socket)
	  {
	    TcpSocket* value = *it;
	    (*it)->disconnect();
	    it = m_socketList.erase(it);
	    delete value;
	  }
	else
	  ++it;
      }
  }